

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O3

TVariableIndex __thiscall
Refal2::CVariablesBuilder::AddRight
          (CVariablesBuilder *this,TVariableName name,TVariableTypeTag type)

{
  int *piVar1;
  int iVar2;
  TVariableType type_00;
  bool bVar3;
  TVariableType TVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  int iVar9;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  TVar4 = checkTypeTag(this,type,(CQualifier **)0x0);
  iVar9 = -1;
  if (TVar4 != VT_None) {
    bVar3 = checkName(this,name);
    if (bVar3) {
      iVar2 = *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4);
      lVar5 = (long)iVar2;
      if (lVar5 == -1) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x13b47e);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar6[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar6;
        }
        local_88 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_70.field_2._M_allocated_capacity = *psVar8;
          local_70.field_2._8_8_ = plVar6[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar8;
          local_70._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_70._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        CErrorsHelper::RaiseError(&this->super_CErrorsHelper,ES_Error,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      else {
        type_00 = this->variables[lVar5].Type;
        if (type_00 == TVar4) {
          piVar1 = &this->variables[lVar5].CountRight;
          *piVar1 = *piVar1 + 1;
          iVar9 = iVar2;
        }
        else {
          errorTypesNotMatched(this,name,type_00);
        }
      }
    }
  }
  return iVar9;
}

Assistant:

TVariableIndex CVariablesBuilder::AddRight( const TVariableName name,
	const TVariableTypeTag type )
{
	const TVariableType variableType = checkTypeTag( type );
	if( variableType != VT_None && checkName( name ) ) {
		const TVariableIndex variableIndex = variableNameToIndex[name];
		if( variableIndex != InvalidVariableIndex ) {
			CVariableData& variable = variables[variableIndex];
			if( variable.Type == variableType ) {
				variable.CountRight++;
				return variableIndex;
			} else {
				errorTypesNotMatched( name, variable.Type );
			}
		} else {
			error( "variable `" + std::string( 1, static_cast<char>( name ) )
				+ "` wasn't defined in left part of rule" );
		}
	}
	return InvalidVariableIndex;
}